

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picklpf.c
# Opt level: O1

int search_filter_level(YV12_BUFFER_CONFIG *sd,AV1_COMP *cpi,int partial_frame,
                       int *last_frame_filter_level,int plane,int dir,int64_t *best_filter_sse)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int64_t iVar6;
  uint uVar7;
  uint filt_level;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int64_t ss_err [64];
  int64_t local_238 [65];
  ulong uVar14;
  
  uVar7 = 0x3f;
  if (AOM_RC_FIRST_PASS < (cpi->oxcf).pass) {
    uVar7 = (uint)((cpi->ppi->twopass).section_intra_rating < 9) << 4 | 0x2f;
  }
  if (plane == 2) {
    uVar11 = last_frame_filter_level[3];
  }
  else if (plane == 1) {
    uVar11 = last_frame_filter_level[2];
  }
  else if (dir == 2) {
    uVar11 = *last_frame_filter_level + last_frame_filter_level[1] + 1 >> 1;
  }
  else {
    uVar11 = last_frame_filter_level[(uint)dir];
  }
  uVar13 = uVar7;
  if ((int)uVar11 < (int)uVar7) {
    uVar13 = uVar11;
  }
  uVar5 = (ulong)uVar13;
  if ((int)uVar11 < 0) {
    uVar5 = 0;
  }
  uVar11 = (uint)uVar5;
  uVar14 = 4;
  if (0xf < uVar11) {
    uVar14 = uVar5 >> 2;
  }
  iVar1 = secconv_lvl3[(cpi->sf).lpf_sf.use_coarse_filter_level_search];
  memset(local_238,0xff,0x200);
  yv12_copy_plane(&((cpi->common).cur_frame)->buf,&cpi->last_frame_uf,plane);
  lVar4 = try_filter_frame(sd,cpi,uVar11,partial_frame,plane,dir);
  local_238[uVar5] = lVar4;
  if (iVar1 < (int)uVar14) {
    iVar10 = 0;
    do {
      uVar13 = (uint)uVar14;
      uVar3 = (uint)uVar5;
      filt_level = uVar13 + uVar3;
      if ((int)uVar7 <= (int)(uVar13 + uVar3)) {
        filt_level = uVar7;
      }
      uVar11 = uVar3 - uVar13;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      uVar12 = uVar3 + 7;
      if (-1 < (int)uVar3) {
        uVar12 = uVar3;
      }
      lVar8 = uVar14 * (lVar4 >> (0xfU - (char)(uVar12 >> 3) & 0x3f));
      if ((AOM_RC_FIRST_PASS < (cpi->oxcf).pass) &&
         (uVar5 = (ulong)(cpi->ppi->twopass).section_intra_rating, uVar5 < 0x14)) {
        lVar8 = (long)(lVar8 * uVar5) / 0x14;
      }
      lVar8 = lVar8 >> ((cpi->common).features.tx_mode != '\0');
      lVar9 = lVar4;
      uVar12 = uVar3;
      if ((iVar10 < 1) && (uVar11 != uVar3)) {
        if (local_238[uVar11] < 0) {
          iVar6 = try_filter_frame(sd,cpi,uVar11,partial_frame,plane,dir);
          local_238[uVar11] = iVar6;
        }
        lVar2 = local_238[uVar11];
        if ((lVar2 < lVar4 + lVar8) && (lVar9 = lVar2, uVar12 = uVar11, lVar4 <= lVar2)) {
          lVar9 = lVar4;
        }
      }
      lVar4 = lVar9;
      uVar11 = uVar12;
      if ((-1 < iVar10) && (filt_level != uVar3)) {
        if (local_238[(int)filt_level] < 0) {
          iVar6 = try_filter_frame(sd,cpi,filt_level,partial_frame,plane,dir);
          local_238[(int)filt_level] = iVar6;
        }
        lVar4 = local_238[(int)filt_level];
        uVar11 = filt_level;
        if (lVar9 - lVar8 <= local_238[(int)filt_level]) {
          lVar4 = lVar9;
          uVar11 = uVar12;
        }
      }
      iVar10 = 0;
      if (uVar11 != uVar3) {
        iVar10 = (uint)((int)uVar3 <= (int)uVar11) * 2 + -1;
      }
      uVar13 = uVar13 >> (uVar11 == uVar3);
      uVar14 = (ulong)uVar13;
      uVar5 = (ulong)uVar11;
    } while (iVar1 < (int)uVar13);
  }
  *best_filter_sse = local_238[(int)uVar11];
  return uVar11;
}

Assistant:

static int search_filter_level(const YV12_BUFFER_CONFIG *sd, AV1_COMP *cpi,
                               int partial_frame,
                               const int *last_frame_filter_level, int plane,
                               int dir, int64_t *best_filter_sse) {
  const AV1_COMMON *const cm = &cpi->common;
  const int min_filter_level = 0;
  const int max_filter_level = get_max_filter_level(cpi);
  int filt_direction = 0;
  int64_t best_err;
  int filt_best;

  // Start the search at the previous frame filter level unless it is now out of
  // range.
  int lvl;
  switch (plane) {
    case 0:
      switch (dir) {
        case 2:
          lvl = (last_frame_filter_level[0] + last_frame_filter_level[1] + 1) >>
                1;
          break;
        case 0:
        case 1: lvl = last_frame_filter_level[dir]; break;
        default: assert(dir >= 0 && dir <= 2); return 0;
      }
      break;
    case 1: lvl = last_frame_filter_level[2]; break;
    case 2: lvl = last_frame_filter_level[3]; break;
    default: assert(plane >= 0 && plane <= 2); return 0;
  }
  int filt_mid = clamp(lvl, min_filter_level, max_filter_level);
  int filter_step = filt_mid < 16 ? 4 : filt_mid / 4;
  // Sum squared error at each filter level
  int64_t ss_err[MAX_LOOP_FILTER + 1];

  const int use_coarse_search = cpi->sf.lpf_sf.use_coarse_filter_level_search;
  assert(use_coarse_search <= 1);
  static const int min_filter_step_lookup[2] = { 0, 2 };
  // min_filter_step_thesh determines the stopping criteria for the search.
  // The search is terminated when filter_step equals min_filter_step_thesh.
  const int min_filter_step_thesh = min_filter_step_lookup[use_coarse_search];

  // Set each entry to -1
  memset(ss_err, 0xFF, sizeof(ss_err));
  yv12_copy_plane(&cm->cur_frame->buf, &cpi->last_frame_uf, plane);
  best_err = try_filter_frame(sd, cpi, filt_mid, partial_frame, plane, dir);
  filt_best = filt_mid;
  ss_err[filt_mid] = best_err;

  while (filter_step > min_filter_step_thesh) {
    const int filt_high = AOMMIN(filt_mid + filter_step, max_filter_level);
    const int filt_low = AOMMAX(filt_mid - filter_step, min_filter_level);

    // Bias against raising loop filter in favor of lowering it.
    int64_t bias = (best_err >> (15 - (filt_mid / 8))) * filter_step;

    if ((is_stat_consumption_stage_twopass(cpi)) &&
        (cpi->ppi->twopass.section_intra_rating < 20))
      bias = (bias * cpi->ppi->twopass.section_intra_rating) / 20;

    // yx, bias less for large block size
    if (cm->features.tx_mode != ONLY_4X4) bias >>= 1;

    if (filt_direction <= 0 && filt_low != filt_mid) {
      // Get Low filter error score
      if (ss_err[filt_low] < 0) {
        ss_err[filt_low] =
            try_filter_frame(sd, cpi, filt_low, partial_frame, plane, dir);
      }
      // If value is close to the best so far then bias towards a lower loop
      // filter value.
      if (ss_err[filt_low] < (best_err + bias)) {
        // Was it actually better than the previous best?
        if (ss_err[filt_low] < best_err) {
          best_err = ss_err[filt_low];
        }
        filt_best = filt_low;
      }
    }

    // Now look at filt_high
    if (filt_direction >= 0 && filt_high != filt_mid) {
      if (ss_err[filt_high] < 0) {
        ss_err[filt_high] =
            try_filter_frame(sd, cpi, filt_high, partial_frame, plane, dir);
      }
      // If value is significantly better than previous best, bias added against
      // raising filter value
      if (ss_err[filt_high] < (best_err - bias)) {
        best_err = ss_err[filt_high];
        filt_best = filt_high;
      }
    }

    // Half the step distance if the best filter value was the same as last time
    if (filt_best == filt_mid) {
      filter_step /= 2;
      filt_direction = 0;
    } else {
      filt_direction = (filt_best < filt_mid) ? -1 : 1;
      filt_mid = filt_best;
    }
  }

  *best_filter_sse = ss_err[filt_best];

  return filt_best;
}